

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocketnotifier.cpp
# Opt level: O1

bool __thiscall QSocketNotifier::event(QSocketNotifier *this,QEvent *e)

{
  quint16 qVar1;
  QObjectData *pQVar2;
  bool bVar3;
  ExternalRefCountData *pEVar4;
  long in_FS_OFFSET;
  undefined4 local_74;
  char local_6d;
  undefined4 local_6c;
  void *local_68;
  undefined4 *puStack_60;
  char *local_58;
  char *pcStack_50;
  QMetaTypeInterface *local_48;
  InterfaceType *pIStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QObject).d_ptr.d;
  qVar1 = e->t;
  if ((qVar1 == 0xd3) || (qVar1 == 0x32)) {
    pEVar4 = QtSharedPointer::ExternalRefCountData::getAndRef(&this->super_QObject);
    local_6c = (undefined4)pQVar2[1].children.d.size;
    local_74 = *(undefined4 *)((long)&pQVar2[1].children.d.size + 4);
    local_68 = (void *)0x0;
    pcStack_50 = &local_6d;
    puStack_60 = &local_6c;
    local_58 = (char *)&local_74;
    QMetaObject::activate(&this->super_QObject,&staticMetaObject,0,&local_68);
    bVar3 = true;
    if (pEVar4 != (ExternalRefCountData *)0x0) {
      if ((pEVar4->strongref)._q_value.super___atomic_base<int>._M_i != 0) {
        local_6c = (undefined4)pQVar2[1].children.d.size;
        local_68 = (void *)0x0;
        puStack_60 = &local_6c;
        local_58 = (char *)&local_74;
        QMetaObject::activate(&this->super_QObject,&staticMetaObject,2,&local_68);
      }
      if (pEVar4 != (ExternalRefCountData *)0x0) {
        LOCK();
        (pEVar4->weakref)._q_value.super___atomic_base<int>._M_i =
             (pEVar4->weakref)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pEVar4->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
          operator_delete(pEVar4);
        }
      }
    }
  }
  else {
    if ((qVar1 == 0x16) && (pQVar2[1].field_0x30 == '\x01')) {
      puStack_60 = (undefined4 *)&pQVar2[1].field_0x30;
      local_68 = (void *)0x0;
      local_58 = (char *)0x0;
      pcStack_50 = "bool";
      local_48 = (QMetaTypeInterface *)0x0;
      pIStack_40 = &QtPrivate::QMetaTypeInterfaceWrapper<bool>::metaType;
      QMetaObject::invokeMethodImpl
                (&this->super_QObject,"setEnabled",QueuedConnection,2,&local_68,&local_58,&local_48)
      ;
      setEnabled(this,false);
    }
    bVar3 = QObject::event(&this->super_QObject,e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocketNotifier::event(QEvent *e)
{
    Q_D(QSocketNotifier);
    // Emits the activated() signal when a QEvent::SockAct or QEvent::SockClose is
    // received.
    switch (e->type()) {
    case QEvent::ThreadChange:
        if (d->snenabled) {
            QMetaObject::invokeMethod(this, "setEnabled", Qt::QueuedConnection,
                                      Q_ARG(bool, d->snenabled));
            setEnabled(false);
        }
        break;
    case QEvent::SockAct:
    case QEvent::SockClose:
        {
            QPointer<QSocketNotifier> alive(this);
            emit activated(d->sockfd, d->sntype, QPrivateSignal());
            // ### Qt7: Remove emission if the activated(int) signal is removed
            if (alive)
                emit activated(int(qintptr(d->sockfd)), QPrivateSignal());
        }
        return true;
    default:
        break;
    }
    return QObject::event(e);
}